

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O3

void __thiscall hdc::Def::addParameter(Def *this,Token *name,Type *type)

{
  pointer *pppPVar1;
  int value;
  iterator __position;
  Variable *this_00;
  Parameter *param;
  Variable *local_28;
  
  this_00 = (Variable *)operator_new(0x68);
  Parameter::Parameter((Parameter *)this_00,name,type);
  value = this->localVarNameCounter;
  this->localVarNameCounter = value + 1;
  local_28 = this_00;
  Variable::setLocalName(this_00,value);
  __position._M_current =
       (this->parameters).super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->parameters).super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::Parameter*,std::allocator<hdc::Parameter*>>::
    _M_realloc_insert<hdc::Parameter*const&>
              ((vector<hdc::Parameter*,std::allocator<hdc::Parameter*>> *)&this->parameters,
               __position,(Parameter **)&local_28);
  }
  else {
    *__position._M_current = (Parameter *)this_00;
    pppPVar1 = &(this->parameters).
                super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

void Def::addParameter(hdc::Token& name, Type* type) {
    Parameter* param;

    param = new Parameter(name, type);
    param->setLocalName(localVarNameCounter++);
    parameters.push_back(param);
}